

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

uchar * golf_base64_decode(uchar *src,int len,int *out_len)

{
  uint uVar1;
  long lVar2;
  byte *mem;
  byte *pbVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uchar block [4];
  uchar dtable [256];
  char local_11c [4];
  char local_118 [61];
  undefined1 local_db;
  
  memset(local_118,0x80,0x100);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    local_118["ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[lVar2]] =
         (char)lVar2;
  }
  local_db = 0;
  if (len < 1) {
    len = 0;
  }
  uVar1 = 0;
  for (uVar5 = 0; (uint)len != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = uVar1 + 1;
  }
  if ((uVar1 & 3) == 0 && uVar1 != 0) {
    mem = (byte *)golf_alloc_tracked((ulong)((uVar1 >> 2) * 3),
                                     "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/base64.c"
                                    );
    iVar6 = 0;
    if (mem != (byte *)0x0) {
      uVar5 = 0;
      iVar4 = 0;
      pbVar3 = mem;
      do {
        if ((uint)len == uVar5) {
LAB_00137522:
          *out_len = (int)pbVar3 - (int)mem;
          return mem;
        }
        if (local_118[src[uVar5]] != -0x80) {
          iVar4 = iVar4 + (uint)(src[uVar5] == 0x3d);
          local_11c[iVar6] = local_118[src[uVar5]];
          iVar6 = iVar6 + 1;
          if (iVar6 == 4) {
            *pbVar3 = (byte)local_11c[1] >> 4 | local_11c[0] << 2;
            pbVar3[1] = (byte)local_11c[2] >> 2 | local_11c[1] << 4;
            pbVar3[2] = local_11c[2] << 6 | local_11c[3];
            if (iVar4 != 0) {
              if (iVar4 == 1) {
                pbVar3 = pbVar3 + 2;
              }
              else {
                if (iVar4 != 2) {
                  golf_free_tracked(mem);
                  return (uchar *)0x0;
                }
                pbVar3 = pbVar3 + 1;
              }
              goto LAB_00137522;
            }
            pbVar3 = pbVar3 + 3;
            iVar6 = 0;
          }
        }
        uVar5 = uVar5 + 1;
      } while( true );
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char * golf_base64_decode(const unsigned char *src, int len,
                  int *out_len)
{
    unsigned char dtable[256], *out, *pos, block[4], tmp;
    int i, count, olen;
    int pad = 0;

    memset(dtable, 0x80, 256);
    for (i = 0; i < (int)sizeof(base64_table) - 1; i++)
        dtable[base64_table[i]] = (unsigned char) i;
    dtable['='] = 0;

    count = 0;
    for (i = 0; i < len; i++) {
        if (dtable[src[i]] != 0x80)
            count++;
    }

    if (count == 0 || count % 4)
        return NULL;

    olen = count / 4 * 3;
    pos = out = golf_alloc(olen);
    if (out == NULL)
        return NULL;

    count = 0;
    for (i = 0; i < len; i++) {
        tmp = dtable[src[i]];
        if (tmp == 0x80)
            continue;

        if (src[i] == '=')
            pad++;
        block[count] = tmp;
        count++;
        if (count == 4) {
            *pos++ = (block[0] << 2) | (block[1] >> 4);
            *pos++ = (block[1] << 4) | (block[2] >> 2);
            *pos++ = (block[2] << 6) | block[3];
            count = 0;
            if (pad) {
                if (pad == 1)
                    pos--;
                else if (pad == 2)
                    pos -= 2;
                else {
                    /* Invalid padding */
                    golf_free(out);
                    return NULL;
                }
                break;
            }
        }
    }

    *out_len = (int)(pos - out);
    return out;
}